

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterList.h
# Opt level: O0

uint bhf::StringTo<unsigned_int>(string *v,uint value)

{
  long lVar1;
  ostream *poVar2;
  _func_ios_base_ptr_ios_base_ptr *local_1c0;
  stringstream local_1a0 [8];
  stringstream converter;
  ostream aoStack_190 [379];
  byte local_15;
  uint local_14;
  bool asHex;
  string *psStack_10;
  uint value_local;
  string *v_local;
  
  local_14 = value;
  psStack_10 = v;
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    lVar1 = std::__cxx11::string::rfind((char *)psStack_10,0x120451);
    local_15 = lVar1 != -1;
    std::__cxx11::stringstream::stringstream(local_1a0);
    if ((local_15 & 1) == 0) {
      local_1c0 = std::dec;
    }
    else {
      local_1c0 = std::hex;
    }
    poVar2 = (ostream *)std::ostream::operator<<(aoStack_190,local_1c0);
    std::operator<<(poVar2,(string *)psStack_10);
    std::istream::operator>>((istream *)local_1a0,&local_14);
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  return local_14;
}

Assistant:

T StringTo(const std::string& v, T value = {})
{
    if (v.size()) {
        const auto asHex = (v.npos != v.rfind("0x", 0));
        std::stringstream converter;
        converter << (asHex ? std::hex : std::dec) << v;
        converter >> value;
    }
    return value;
}